

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

value_type * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
          (value_type *__return_storage_ptr__,optional<std::__cxx11::string> *this,char (*v) [1])

{
  allocator local_9;
  
  if (*this == (optional<std::__cxx11::string>)0x1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this + 8));
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,*v,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr value_type value_or( U && v ) const optional_ref_qual
    {
        return has_value() ? contained.value() : static_cast<T>(std::forward<U>( v ) );
    }